

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O2

int doinvoke(obj *obj)

{
  boolean bVar1;
  int iVar2;
  
  if (obj == (obj *)0x0) {
    obj = getobj("\x14","invoke, break, or rub",(obj **)0x0);
    if (obj == (obj *)0x0) {
      return 0;
    }
  }
  else {
    bVar1 = validate_object(obj,"\x14","invoke, break, or rub");
    if (bVar1 == '\0') {
      return 0;
    }
  }
  if ((obj->oartifact != '\0') && (iVar2 = touch_artifact(obj,&youmonst), iVar2 == 0)) {
    return 1;
  }
  iVar2 = arti_invoke(obj);
  return iVar2;
}

Assistant:

int doinvoke(struct obj *obj)
{
    if (obj && !validate_object(obj, invoke_types, "invoke, break, or rub"))
	return 0;
    else if (!obj)
	obj = getobj(invoke_types, "invoke, break, or rub", NULL);
    if (!obj) return 0;
    
    if (obj->oartifact && !touch_artifact(obj, &youmonst))
	return 1;
    return arti_invoke(obj);
}